

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack6(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x1a;
    out_local[1] = *in_local >> 0x14 & 0x3f;
    out_local[2] = *in_local >> 0xe & 0x3f;
    out_local[3] = *in_local >> 8 & 0x3f;
    out_local[4] = *in_local >> 2 & 0x3f;
    out_local[5] = (*in_local & 3) << 4;
    out_local[5] = in_local[1] >> 0x1c | out_local[5];
    out_local[6] = in_local[1] >> 0x16 & 0x3f;
    out_local[7] = in_local[1] >> 0x10 & 0x3f;
    out_local[8] = in_local[1] >> 10 & 0x3f;
    out_local[9] = in_local[1] >> 4 & 0x3f;
    out_local[10] = (in_local[1] & 0xf) << 2;
    out_local[10] = in_local[2] >> 0x1e | out_local[10];
    out_local[0xb] = in_local[2] >> 0x18 & 0x3f;
    out_local[0xc] = in_local[2] >> 0x12 & 0x3f;
    out_local[0xd] = in_local[2] >> 0xc & 0x3f;
    out_local[0xe] = in_local[2] >> 6 & 0x3f;
    out_local[0xf] = in_local[2] & 0x3f;
    out_local[0x10] = in_local[3] >> 0x1a;
    out_local[0x11] = in_local[3] >> 0x14 & 0x3f;
    out_local[0x12] = in_local[3] >> 0xe & 0x3f;
    out_local[0x13] = in_local[3] >> 8 & 0x3f;
    out_local[0x14] = in_local[3] >> 2 & 0x3f;
    out_local[0x15] = (in_local[3] & 3) << 4;
    out_local[0x15] = in_local[4] >> 0x1c | out_local[0x15];
    out_local[0x16] = in_local[4] >> 0x16 & 0x3f;
    out_local[0x17] = in_local[4] >> 0x10 & 0x3f;
    out_local[0x18] = in_local[4] >> 10 & 0x3f;
    out_local[0x19] = in_local[4] >> 4 & 0x3f;
    out_local[0x1a] = (in_local[4] & 0xf) << 2;
    out_local[0x1a] = in_local[5] >> 0x1e | out_local[0x1a];
    out_local[0x1b] = in_local[5] >> 0x18 & 0x3f;
    out_local[0x1c] = in_local[5] >> 0x12 & 0x3f;
    out_local[0x1d] = in_local[5] >> 0xc & 0x3f;
    out_local[0x1e] = in_local[5] >> 6 & 0x3f;
    out_local[0x1f] = in_local[5] & 0x3f;
    out_local = out_local + 0x20;
    in_local = in_local + 6;
  }
  return;
}

Assistant:

void __vseblocks_unpack6(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 6, --bs) {
    out[0] = in[0] >> 26;
    out[1] = (in[0] >> 20) & 0x3f;
    out[2] = (in[0] >> 14) & 0x3f;
    out[3] = (in[0] >> 8) & 0x3f;
    out[4] = (in[0] >> 2) & 0x3f;
    out[5] = (in[0] << 4) & 0x3f;
    out[5] |= in[1] >> 28;
    out[6] = (in[1] >> 22) & 0x3f;
    out[7] = (in[1] >> 16) & 0x3f;
    out[8] = (in[1] >> 10) & 0x3f;
    out[9] = (in[1] >> 4) & 0x3f;
    out[10] = (in[1] << 2) & 0x3f;
    out[10] |= in[2] >> 30;
    out[11] = (in[2] >> 24) & 0x3f;
    out[12] = (in[2] >> 18) & 0x3f;
    out[13] = (in[2] >> 12) & 0x3f;
    out[14] = (in[2] >> 6) & 0x3f;
    out[15] = in[2] & 0x3f;
    out[16] = in[3] >> 26;
    out[17] = (in[3] >> 20) & 0x3f;
    out[18] = (in[3] >> 14) & 0x3f;
    out[19] = (in[3] >> 8) & 0x3f;
    out[20] = (in[3] >> 2) & 0x3f;
    out[21] = (in[3] << 4) & 0x3f;
    out[21] |= in[4] >> 28;
    out[22] = (in[4] >> 22) & 0x3f;
    out[23] = (in[4] >> 16) & 0x3f;
    out[24] = (in[4] >> 10) & 0x3f;
    out[25] = (in[4] >> 4) & 0x3f;
    out[26] = (in[4] << 2) & 0x3f;
    out[26] |= in[5] >> 30;
    out[27] = (in[5] >> 24) & 0x3f;
    out[28] = (in[5] >> 18) & 0x3f;
    out[29] = (in[5] >> 12) & 0x3f;
    out[30] = (in[5] >> 6) & 0x3f;
    out[31] = in[5] & 0x3f;
  }
}